

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void explainTempTable(Parse *pParse,char *zUsage)

{
  Vdbe *p;
  int addr;
  char *zP4;
  
  if (pParse->explain == '\x02') {
    p = pParse->pVdbe;
    zP4 = sqlite3MPrintf(pParse->db,"USE TEMP B-TREE FOR %s",zUsage);
    addr = sqlite3VdbeAddOp3(p,0x96,pParse->iSelectId,0,0);
    sqlite3VdbeChangeP4(p,addr,zP4,-1);
    return;
  }
  return;
}

Assistant:

static void explainTempTable(Parse *pParse, const char *zUsage){
  if( pParse->explain==2 ){
    Vdbe *v = pParse->pVdbe;
    char *zMsg = sqlite3MPrintf(pParse->db, "USE TEMP B-TREE FOR %s", zUsage);
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
}